

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ios_prop.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  propery *ppVar5;
  runtime_error *prVar6;
  stringstream ss;
  stringstream ss2;
  string local_360;
  locale local_340 [8];
  string local_338 [4];
  ios_base local_2b8 [264];
  string local_1b0 [4];
  ios_base aiStack_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)
                     ((long)&local_338[0]._M_dataplus._M_p +
                     *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," !prop_type::has(ss)",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_338[0]._M_dataplus._M_p +
                      *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss).x==-1",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)
                     ((long)&local_338[0]._M_dataplus._M_p +
                     *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::has(ss)",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==1",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base(local_2b8);
  test_counter = test_counter + 1;
  if (counter != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==0",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)&local_338[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_338);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
  counter = counter + 1;
  local_1b0[0]._M_dataplus._M_p._0_4_ = 1;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)local_1b0,
             (ios_base *)
             ((long)&local_338[0]._M_dataplus._M_p +
             *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  counter = counter + -1;
  test_counter = test_counter + 1;
  if (counter != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==1",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_338[0]._M_dataplus._M_p +
                      *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss).x==1",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base(local_2b8);
  test_counter = test_counter + 1;
  if (counter != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==0",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)&local_338[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_338);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
  counter = counter + 1;
  local_1b0[0]._M_dataplus._M_p._0_4_ = 1;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)local_1b0,
             (ios_base *)
             ((long)&local_338[0]._M_dataplus._M_p +
             *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  counter = counter + -1;
  test_counter = test_counter + 1;
  if (counter != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==1",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_338[0]._M_dataplus._M_p +
                      *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss).x==1",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_1b0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base(local_2b8);
  test_counter = test_counter + 1;
  if (counter != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==0",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)&local_338[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_338);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  counter = counter + 1;
  local_360._M_dataplus._M_p._0_4_ = 2;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)&local_360,
             (ios_base *)
             ((long)&local_338[0]._M_dataplus._M_p +
             *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  counter = counter + -1;
  std::ios::copyfmt((ios *)((long)&local_1b0[0]._M_dataplus._M_p +
                           *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18)));
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_338[0]._M_dataplus._M_p +
                      *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss).x==2",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)
                     ((long)&local_1b0[0]._M_dataplus._M_p +
                     *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18)));
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::has(ss2)",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)
                     ((long)&local_338[0]._M_dataplus._M_p +
                     *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::has(ss)",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_1b0[0]._M_dataplus._M_p +
                      *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss2).x==2",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_1b0[0]._M_dataplus._M_p +
                      *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18)));
  ppVar5->x = 3;
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_1b0[0]._M_dataplus._M_p +
                      *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss2).x==3",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((long)&local_338[0]._M_dataplus._M_p +
                      *(long *)(local_338[0]._M_dataplus._M_p + -0x18)));
  if (ppVar5->x != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," prop_type::get(ss).x==2",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==2",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (imbued != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," imbued==0",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::classic();
  std::ios::imbue(local_340);
  std::locale::~locale(local_340);
  test_counter = test_counter + 1;
  if (imbued != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," imbued==1",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_360,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_360);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base(local_2b8);
  test_counter = test_counter + 1;
  if (counter != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," counter==0",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)&local_338[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,local_338);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  iVar3 = test_counter - error_counter;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < error_counter) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed ",7);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,error_counter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," tests",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  lVar1 = std::cout;
  *(uint *)(std::locale::~locale + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::~locale + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::locale::classic + *(long *)(lVar1 + -0x18)) = 1;
  *(undefined8 *)(std::runtime_error::what + *(long *)(lVar1 + -0x18)) = 5;
  poVar4 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"% of tests completed sucsessefully",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        {
            std::stringstream ss;
            TEST(!prop_type::has(ss));
            TEST(prop_type::get(ss).x==-1);
            TEST(prop_type::has(ss));
            TEST(counter==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss,ss2;
            prop_type::set(propery(2),ss);
            ss2.copyfmt(ss);
            TEST(prop_type::get(ss).x==2);
            TEST(prop_type::has(ss2));
            TEST(prop_type::has(ss));
            TEST(prop_type::get(ss2).x==2);
            prop_type::get(ss2).x=3;
            TEST(prop_type::get(ss2).x==3);
            TEST(prop_type::get(ss).x==2);
            TEST(counter==2);
            TEST(imbued==0);
            ss2.imbue(std::locale::classic());
            TEST(imbued==1);
        }
        TEST(counter==0);
    }catch(std::exception const &e) {
        std::cerr << "Fail:" << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
    return 0;
}